

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.h
# Opt level: O0

HMInteger __thiscall hypermind::CompileUnit::AddConstant(CompileUnit *this,Value *value)

{
  HMUINT32 HVar1;
  Value *value_local;
  CompileUnit *this_local;
  
  HVar1 = Buffer<hypermind::Value>::push(&this->mFn->constants,&this->mVM->mGCHeap,value);
  return HVar1;
}

Assistant:

HMInteger AddConstant(const Value &value) {
            // TODO 现在直接将value存到constants中了
            //  相同的文本或者数值会造成资源重复 可以先取hash
            return mFn->constants.push(&mVM->mGCHeap, value);
        }